

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Appearance_PDU::SetEntityCapabilities(Appearance_PDU *this,EntityCapabilities *EC)

{
  KUINT16 *pKVar1;
  
  if (((this->m_AppearanceFlag1Union).m_ui8Flag & 0x10) == 0) {
    (this->m_AppearanceFlag1Union).m_ui8Flag = (this->m_AppearanceFlag1Union).m_ui8Flag | 0x10;
    pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + 4;
  }
  (this->m_EntityCapabilities).field_0 = EC->field_0;
  return;
}

Assistant:

void Appearance_PDU::SetCapabilitiesFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_AppearanceFlag1Union.m_ui8Cap )return;

    m_AppearanceFlag1Union.m_ui8Cap = F;

    if( F )
    {
        m_ui16PDULength += EntityCapabilities::ENTITY_CAPABILITIES_SIZE;
    }
    else
    {
        m_ui16PDULength -= EntityCapabilities::ENTITY_CAPABILITIES_SIZE;
    }
}